

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

void __thiscall phosg::StringReader::skip(StringReader *this,size_t bytes)

{
  out_of_range *this_00;
  size_t bytes_local;
  StringReader *this_local;
  
  this->offset = bytes + this->offset;
  if (this->length < this->offset) {
    this->offset = this->length;
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    ::std::out_of_range::out_of_range(this_00,"skip beyond end of string");
    __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
  }
  return;
}

Assistant:

void StringReader::skip(size_t bytes) {
  this->offset += bytes;
  if (this->offset > this->length) {
    this->offset = this->length;
    throw out_of_range("skip beyond end of string");
  }
}